

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_parse_result * __thiscall
pugi::xml_document::load
          (xml_parse_result *__return_storage_ptr__,xml_document *this,
          basic_istream<wchar_t,_std::char_traits<wchar_t>_> *stream,uint options)

{
  xml_document_struct *doc;
  undefined *puVar1;
  xml_parse_status xVar2;
  uint uVar3;
  xml_encoding encoding;
  long lVar4;
  long lVar5;
  undefined8 *puVar6;
  void *contents;
  ulong uVar7;
  ulong uVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  ulong uVar11;
  undefined8 *puVar12;
  void *__dest;
  bool bVar13;
  undefined1 auVar14 [16];
  xml_parse_status local_50;
  
  reset(this);
  if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) != 0) {
    xml_parse_result::xml_parse_result(__return_storage_ptr__);
    __return_storage_ptr__->status = status_io_error;
    goto LAB_002b1da0;
  }
  doc = (xml_document_struct *)(this->super_xml_node)._root;
  lVar4 = std::wistream::tellg();
  if (lVar4 < 0) {
    std::wios::clear((int)*(undefined8 *)(*(long *)stream + -0x18) + (int)stream);
    uVar3 = *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20);
    local_50 = status_out_of_memory;
    puVar10 = (undefined8 *)0x0;
    uVar11 = 0;
    puVar12 = (undefined8 *)0x0;
LAB_002b1bda:
    puVar9 = puVar10;
    if ((uVar3 & 2) == 0) {
      puVar6 = (undefined8 *)
               (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)(0x7fe8);
      if (puVar6 != (undefined8 *)0x0) {
        *puVar6 = 0;
        puVar6[1] = 0;
        puVar9 = puVar6;
        if (puVar12 != (undefined8 *)0x0) {
          *puVar12 = puVar6;
          puVar9 = puVar10;
        }
        std::wistream::read((wchar_t *)stream,(long)(puVar6 + 2));
        uVar7 = *(long *)(stream + 8) * 4;
        puVar6[1] = uVar7;
        uVar3 = *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20);
        contents = (void *)0x0;
        puVar10 = puVar9;
        if (((uVar3 & 1) == 0) && ((uVar3 & 6) != 4)) goto code_r0x002b1c56;
        uVar11 = 0;
        bVar13 = false;
        local_50 = status_io_error;
        goto LAB_002b1d6d;
      }
    }
    else {
      contents = (void *)(*(code *)impl::(anonymous_namespace)::
                                   xml_memory_management_function_storage<int>::allocate)
                                   (uVar11 + 1);
      if (contents != (void *)0x0) {
        __dest = contents;
        for (puVar12 = puVar10; puVar12 != (undefined8 *)0x0; puVar12 = (undefined8 *)*puVar12) {
          if ((void *)((long)contents + uVar11) < (void *)((long)__dest + puVar12[1])) {
            __assert_fail("write + chunk->size <= buffer + total",
                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                          ,0x1359,
                          "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_noseek(std::basic_istream<T> &, void **, size_t *) [T = wchar_t]"
                         );
          }
          memcpy(__dest,puVar12 + 2,puVar12[1]);
          __dest = (void *)((long)__dest + puVar12[1]);
        }
        if (__dest != (void *)((long)contents + uVar11)) {
          __assert_fail("write == buffer + total",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                        ,0x135e,
                        "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_noseek(std::basic_istream<T> &, void **, size_t *) [T = wchar_t]"
                       );
        }
        local_50 = status_ok;
        bVar13 = true;
        goto LAB_002b1d6d;
      }
    }
    goto LAB_002b1d45;
  }
  auVar14 = std::wistream::tellg();
  lVar4 = auVar14._0_8_;
  std::wistream::seekg((long)stream,_S_beg);
  lVar5 = std::wistream::tellg();
  std::wistream::seekg(stream,lVar4,auVar14._8_8_);
  xVar2 = status_io_error;
  if (-1 < lVar4 && ((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) == 0) {
    uVar11 = lVar5 - lVar4;
    local_50 = status_out_of_memory;
    xVar2 = status_out_of_memory;
    if ((-1 < (long)uVar11) &&
       (contents = (void *)(*(code *)impl::(anonymous_namespace)::
                                     xml_memory_management_function_storage<int>::allocate)
                                     (uVar11 * 4 + 1),
       puVar1 = impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
       , xVar2 = local_50, contents != (void *)0x0)) {
      std::wistream::read((wchar_t *)stream,(long)contents);
      if ((*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 6) != 4 &&
          (*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 1) == 0) {
        if (uVar11 < *(ulong *)(stream + 8)) {
          __assert_fail("actual_length <= read_length",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                        ,0x1383,
                        "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_seek(std::basic_istream<T> &, void **, size_t *) [T = wchar_t]"
                       );
        }
        uVar11 = *(ulong *)(stream + 8) << 2;
        goto LAB_002b1dcb;
      }
      (*(code *)puVar1)(contents);
      local_50 = status_io_error;
      xVar2 = local_50;
    }
  }
  goto LAB_002b1d92;
code_r0x002b1c56:
  uVar8 = uVar7 + uVar11;
  if (uVar7 + uVar11 <= uVar11) {
    uVar8 = uVar11;
  }
  bVar13 = CARRY8(uVar7,uVar11);
  uVar11 = uVar8;
  puVar12 = puVar6;
  if (bVar13) goto LAB_002b1d45;
  goto LAB_002b1bda;
LAB_002b1d45:
  contents = (void *)0x0;
  uVar11 = 0;
  bVar13 = false;
  puVar10 = puVar9;
LAB_002b1d6d:
  if (puVar10 != (undefined8 *)0x0) {
    while (puVar10 != (undefined8 *)0x0) {
      puVar12 = (undefined8 *)*puVar10;
      (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
      )(puVar10);
      puVar10 = puVar12;
    }
  }
  xVar2 = local_50;
  if (bVar13) {
LAB_002b1dcb:
    encoding = impl::anon_unknown_0::get_buffer_encoding(encoding_wchar,contents,uVar11);
    if (encoding == encoding_utf8) {
      *(undefined1 *)((long)contents + uVar11) = 0;
      uVar11 = uVar11 + 1;
    }
    impl::anon_unknown_0::load_buffer_impl
              (__return_storage_ptr__,doc,(xml_node_struct *)doc,contents,uVar11,options,encoding,
               true,true,&this->_buffer);
    return __return_storage_ptr__;
  }
LAB_002b1d92:
  local_50 = xVar2;
  xml_parse_result::xml_parse_result(__return_storage_ptr__);
  __return_storage_ptr__->status = local_50;
LAB_002b1da0:
  __return_storage_ptr__->offset = 0;
  return __return_storage_ptr__;
}

Assistant:

PUGI_IMPL_FN xml_parse_result xml_document::load(std::basic_istream<wchar_t, std::char_traits<wchar_t> >& stream, unsigned int options)
	{
		reset();

		return impl::load_stream_impl(static_cast<impl::xml_document_struct*>(_root), stream, options, encoding_wchar, &_buffer);
	}